

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_enrich3(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_NODE ref_node;
  bool bVar2;
  REF_EDGE pRVar3;
  REF_GRID pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  void *__ptr;
  long lVar7;
  long lVar8;
  REF_INT cell;
  REF_CELL pRVar9;
  char *pcVar10;
  int iVar11;
  REF_INT node;
  REF_EDGE ref_edge;
  REF_GLOB global;
  REF_INT new_cell;
  REF_INT part;
  REF_INT local_d0;
  REF_INT local_cc;
  REF_EDGE local_c8;
  REF_GRID local_c0;
  REF_GLOB local_b8;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8 [4];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  REF_INT local_84;
  
  pRVar1 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar5 = ref_geom_constrain_all(ref_grid);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1004,
           "ref_geom_enrich3",(ulong)uVar5,"constrain");
    return uVar5;
  }
  uVar5 = ref_edge_create(&local_c8,ref_grid);
  pRVar3 = local_c8;
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1006,
           "ref_geom_enrich3",(ulong)uVar5,"edge");
    return uVar5;
  }
  local_c0 = ref_grid;
  if (local_c8->n < 0) {
    uVar5 = 1;
    pcVar10 = "malloc edge_node of REF_INT negative";
  }
  else {
    __ptr = malloc((ulong)(uint)local_c8->n << 3);
    if (__ptr != (void *)0x0) {
      bVar2 = true;
      uVar5 = 0;
      if (0 < pRVar3->n) {
        lVar7 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar7 * 4) = 0xffffffff;
          lVar7 = lVar7 + 1;
          lVar8 = (long)pRVar3->n;
        } while (SBORROW8(lVar7,lVar8 * 2) != lVar7 + lVar8 * -2 < 0);
      }
      goto LAB_001a9cb2;
    }
    uVar5 = 2;
    pcVar10 = "malloc edge_node of REF_INT NULL";
  }
  bVar2 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1007,
         "ref_geom_enrich3",pcVar10);
  __ptr = (void *)0x0;
LAB_001a9cb2:
  if (bVar2) {
    local_d0 = 0;
    if (0 < local_c8->n) {
      do {
        uVar5 = ref_edge_part(local_c8,local_d0,&local_ac);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x1009,"ref_geom_enrich3",(ulong)uVar5,"edge part");
          return uVar5;
        }
        if (pRVar1->id == local_ac) {
          uVar5 = ref_node_next_global(ref_node,&local_b8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x100c,"ref_geom_enrich3",(ulong)uVar5,"next global");
            return uVar5;
          }
          uVar5 = ref_node_add(ref_node,local_b8,&local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x100d,"ref_geom_enrich3",(ulong)uVar5,"add node");
            return uVar5;
          }
          *(REF_INT *)((long)__ptr + (long)local_d0 * 8) = local_cc;
          uVar5 = ref_node_interpolate_edge
                            (ref_node,local_c8->e2n[(long)local_d0 * 2],
                             local_c8->e2n[local_d0 * 2 + 1],0.3333333333333333,local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1011,"ref_geom_enrich3",(ulong)uVar5,"new node");
            return uVar5;
          }
          uVar5 = ref_geom_add_constrain_midnode
                            (local_c0,local_c8->e2n[(long)local_d0 * 2],
                             local_c8->e2n[local_d0 * 2 + 1],0.3333333333333333,local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1015,"ref_geom_enrich3",(ulong)uVar5,"new geom");
            return uVar5;
          }
          uVar5 = ref_node_next_global(ref_node,&local_b8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1017,"ref_geom_enrich3",(ulong)uVar5,"next global");
            return uVar5;
          }
          uVar5 = ref_node_add(ref_node,local_b8,&local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1018,"ref_geom_enrich3",(ulong)uVar5,"add node");
            return uVar5;
          }
          *(REF_INT *)((long)__ptr + (long)local_d0 * 8 + 4) = local_cc;
          uVar5 = ref_node_interpolate_edge
                            (ref_node,local_c8->e2n[local_d0 * 2],
                             local_c8->e2n[(long)local_d0 * 2 + 1],0.6666666666666666,local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x101c,"ref_geom_enrich3",(ulong)uVar5,"new node");
            return uVar5;
          }
          uVar5 = ref_geom_add_constrain_midnode
                            (local_c0,local_c8->e2n[(long)local_d0 * 2],
                             local_c8->e2n[local_d0 * 2 + 1],0.6666666666666666,local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1020,"ref_geom_enrich3",(ulong)uVar5,"new geom");
            return uVar5;
          }
        }
        local_d0 = local_d0 + 1;
      } while (local_d0 < local_c8->n);
    }
    pRVar9 = local_c0->cell[0];
    if (0 < pRVar9->max) {
      iVar11 = 0;
      do {
        RVar6 = ref_cell_nodes(pRVar9,iVar11,local_a8);
        if (RVar6 == 0) {
          local_a8[local_c0->cell[2]->node_per] = local_a8[local_c0->cell[0]->node_per];
          uVar5 = ref_edge_with(local_c8,local_a8[0],local_a8[1],&local_d0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1028,"ref_geom_enrich3",(ulong)uVar5,"find edge01");
            return uVar5;
          }
          lVar8 = (long)local_d0;
          lVar7 = lVar8 * 2;
          if (local_a8[0] == local_c8->e2n[lVar8 * 2]) {
            local_a8[2] = *(REF_INT *)((long)__ptr + lVar8 * 8);
            lVar7 = (long)(int)((uint)lVar7 | 1);
          }
          else {
            local_a8[2] = *(REF_INT *)((long)__ptr + (long)(int)((uint)lVar7 | 1) * 4);
          }
          local_a8[3] = *(undefined4 *)((long)__ptr + lVar7 * 4);
          uVar5 = ref_cell_add(local_c0->cell[2],local_a8,&local_b0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1031,"ref_geom_enrich3",(ulong)uVar5,"add");
            return uVar5;
          }
        }
        iVar11 = iVar11 + 1;
        pRVar9 = local_c0->cell[0];
      } while (iVar11 < pRVar9->max);
    }
    pRVar9 = local_c0->cell[3];
    if (0 < pRVar9->max) {
      cell = 0;
      do {
        RVar6 = ref_cell_nodes(pRVar9,cell,local_a8);
        if (RVar6 == 0) {
          uVar5 = ref_node_next_global(ref_node,&local_b8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1035,"ref_geom_enrich3",(ulong)uVar5,"next global");
            return uVar5;
          }
          uVar5 = ref_node_add(ref_node,local_b8,&local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1036,"ref_geom_enrich3",(ulong)uVar5,"add node");
            return uVar5;
          }
          uVar5 = ref_node_interpolate_face(ref_node,local_a8[0],local_a8[1],local_a8[2],local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1038,"ref_geom_enrich3",(ulong)uVar5,"new node");
            return uVar5;
          }
          uVar5 = ref_geom_add_constrain_inside_midnode(local_c0,local_a8,local_cc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x103a,"ref_geom_enrich3",(ulong)uVar5,"new node");
            return uVar5;
          }
          local_84 = local_cc;
          local_a8[local_c0->cell[5]->node_per] = local_a8[local_c0->cell[3]->node_per];
          uVar5 = ref_edge_with(local_c8,local_a8[0],local_a8[1],&local_d0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1040,"ref_geom_enrich3",(ulong)uVar5,"find edge01");
            return uVar5;
          }
          lVar8 = (long)local_d0;
          lVar7 = lVar8 * 2;
          if (local_a8[0] == local_c8->e2n[lVar8 * 2]) {
            local_a8[3] = *(undefined4 *)((long)__ptr + lVar8 * 8);
            lVar7 = (long)(int)((uint)lVar7 | 1);
          }
          else {
            local_a8[3] = *(undefined4 *)((long)__ptr + (long)(int)((uint)lVar7 | 1) * 4);
          }
          local_98 = *(undefined4 *)((long)__ptr + lVar7 * 4);
          uVar5 = ref_edge_with(local_c8,local_a8[1],local_a8[2],&local_d0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1048,"ref_geom_enrich3",(ulong)uVar5,"find edge12");
            return uVar5;
          }
          lVar8 = (long)local_d0;
          lVar7 = lVar8 * 2;
          if (local_a8[1] == local_c8->e2n[lVar8 * 2]) {
            local_94 = *(undefined4 *)((long)__ptr + lVar8 * 8);
            lVar7 = (long)(int)((uint)lVar7 | 1);
          }
          else {
            local_94 = *(undefined4 *)((long)__ptr + (long)(int)((uint)lVar7 | 1) * 4);
          }
          local_90 = *(undefined4 *)((long)__ptr + lVar7 * 4);
          uVar5 = ref_edge_with(local_c8,local_a8[2],local_a8[0],&local_d0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1050,"ref_geom_enrich3",(ulong)uVar5,"find edge20");
            return uVar5;
          }
          lVar8 = (long)local_d0;
          lVar7 = lVar8 * 2;
          if (local_a8[2] == local_c8->e2n[lVar8 * 2]) {
            local_8c = *(undefined4 *)((long)__ptr + lVar8 * 8);
            lVar7 = (long)(int)((uint)lVar7 | 1);
          }
          else {
            local_8c = *(undefined4 *)((long)__ptr + (long)(int)((uint)lVar7 | 1) * 4);
          }
          local_88 = *(undefined4 *)((long)__ptr + lVar7 * 4);
          uVar5 = ref_cell_add(local_c0->cell[5],local_a8,&local_b0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1059,"ref_geom_enrich3",(ulong)uVar5,"add");
            return uVar5;
          }
        }
        cell = cell + 1;
        pRVar9 = local_c0->cell[3];
      } while (cell < pRVar9->max);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    uVar5 = ref_edge_free(local_c8);
    pRVar4 = local_c0;
    if (uVar5 == 0) {
      pRVar9 = local_c0->cell[0];
      if (0 < pRVar9->max) {
        iVar11 = 0;
        do {
          if (pRVar9->c2n[(long)iVar11 * (long)pRVar9->size_per] != -1) {
            ref_cell_remove(pRVar9,iVar11);
          }
          iVar11 = iVar11 + 1;
          pRVar9 = pRVar4->cell[0];
        } while (iVar11 < pRVar9->max);
      }
      pRVar9 = pRVar4->cell[3];
      if (pRVar9->max < 1) {
        uVar5 = 0;
      }
      else {
        iVar11 = 0;
        uVar5 = 0;
        do {
          if (pRVar9->c2n[(long)iVar11 * (long)pRVar9->size_per] != -1) {
            ref_cell_remove(pRVar9,iVar11);
          }
          iVar11 = iVar11 + 1;
          pRVar9 = local_c0->cell[3];
        } while (iVar11 < pRVar9->max);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x105d
             ,"ref_geom_enrich3",(ulong)uVar5,"free edge");
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich3(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_DBL t;

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, 2 * ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      t = 1.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[0 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
      t = 2.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[1 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
    }
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[2] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[3] = edge_node[1 + 2 * edge];
    } else {
      nodes[2] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[3] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "add node");
    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "new node");
    RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
        "new node");
    nodes[9] = node;

    nodes[ref_cell_id_index(ref_grid_tr3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[3] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[4] = edge_node[1 + 2 * edge];
    } else {
      nodes[3] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[4] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    if (nodes[1] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[5] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[6] = edge_node[1 + 2 * edge];
    } else {
      nodes[5] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[6] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    if (nodes[2] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[7] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[8] = edge_node[1 + 2 * edge];
    } else {
      nodes[7] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[8] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_tr3(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }

  return REF_SUCCESS;
}